

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

boolean autopickup_match(obj *obj)

{
  boolean bVar1;
  char *pcVar2;
  size_t sVar3;
  int local_34;
  nh_bucstatus objbuc;
  char *objdesc;
  nh_autopickup_rule *r;
  int i;
  obj *obj_local;
  
  if (iflags.ap_rules != (nh_autopickup_rules *)0x0) {
    pcVar2 = doname_price(obj);
    pcVar2 = makesingular(pcVar2);
    if ((*(uint *)&obj->field_0x4a >> 6 & 1) == 0) {
      local_34 = 0;
    }
    else if ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0) {
      if ((*(uint *)&obj->field_0x4a & 1) == 0) {
        local_34 = 2;
      }
      else {
        local_34 = 3;
      }
    }
    else {
      local_34 = 1;
    }
    objdesc = (iflags.ap_rules)->rules->pattern;
    for (r._4_4_ = 0; r._4_4_ < (iflags.ap_rules)->num_rules; r._4_4_ = r._4_4_ + 1) {
      sVar3 = strlen(objdesc);
      if ((((sVar3 == 0) || (bVar1 = pmatch(objdesc,pcVar2), bVar1 != '\0')) &&
          ((*(int *)(objdesc + 0x28) == 0x61 ||
           (*(int *)(objdesc + 0x28) == (int)""[(int)obj->oclass])))) &&
         ((*(int *)(objdesc + 0x2c) == 4 || (*(int *)(objdesc + 0x2c) == local_34)))) {
        return *(int *)(objdesc + 0x30) == 0;
      }
      objdesc = objdesc + 0x34;
    }
  }
  return '\0';
}

Assistant:

static boolean autopickup_match(struct obj *obj)
{
	int i;
	struct nh_autopickup_rule *r;
	char *objdesc;
	enum nh_bucstatus objbuc;
	
	if (!iflags.ap_rules)
	    return FALSE;
	
	objdesc = makesingular(doname_price(obj));
	if (obj->bknown) {
	    if (obj->blessed)
		objbuc = B_BLESSED;
	    else if (obj->cursed)
		objbuc = B_CURSED;
	    else
		objbuc = B_UNCURSED;
	} else
	    objbuc = B_UNKNOWN;
	
	/* test the aotupickup rules in order. If any of the rules matches this
	 * object, return the result */
	r = &iflags.ap_rules->rules[0];
	for (i = 0; i < iflags.ap_rules->num_rules; i++, r++) {
	    if ((!strlen(r->pattern) || pmatch(r->pattern, objdesc)) &&
		(r->oclass == OCLASS_ANY || r->oclass == def_oc_syms[(int)obj->oclass]) &&
		(r->buc == B_DONT_CARE || r->buc == objbuc))
		return r->action == AP_GRAB;
	}
	return FALSE;
}